

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

Ref<embree::XML> __thiscall embree::XML::childOpt(XML *this,string *childID)

{
  __type_conflict1 _Var1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  XML *in_RDI;
  size_t i;
  XML *__rhs;
  ulong local_40;
  
  local_40 = 0;
  __rhs = in_RDI;
  while( true ) {
    sVar2 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                      ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                        *)(in_RSI + 4));
    if (sVar2 <= local_40) {
      (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
      return (Ref<embree::XML>)__rhs;
    }
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (in_RSI + 4),local_40);
    _Var1 = std::operator==(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
    if (_Var1) break;
    local_40 = local_40 + 1;
  }
  pvVar3 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
           operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       *)(in_RSI + 4),local_40);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pvVar3->ptr;
  if ((in_RDI->super_RefCount)._vptr_RefCount == (_func_int **)0x0) {
    return (Ref<embree::XML>)__rhs;
  }
  (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  return (Ref<embree::XML>)__rhs;
}

Assistant:

const Ref<XML> childOpt(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      return null;
    }